

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8DifferentPoliciesTest12<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section8DifferentPoliciesTest12
          (Section8DifferentPoliciesTest12<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8DifferentPoliciesTest12) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "PoliciesP3CACert",
                               "DifferentPoliciesTest12EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "PoliciesP3CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.12";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}